

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O0

int LaunchLabExecutable(char *labExe)

{
  int iVar1;
  undefined1 local_148 [4];
  int retCode;
  sigaction old;
  sigaction new;
  char *labExe_local;
  
  new.sa_restorer = (_func_void *)labExe;
  memset(&old.sa_restorer,0,0x98);
  old.sa_restorer = SigchldTrap;
  sigemptyset((sigset_t *)&new);
  new.sa_mask.__val[0xf]._0_4_ = 1;
  iVar1 = sigaction(0x11,(sigaction *)&old.sa_restorer,(sigaction *)local_148);
  if (iVar1 == 0) {
    labExe_local._4_4_ = _LaunchLabExecutable((char *)new.sa_restorer);
    iVar1 = sigaction(0x11,(sigaction *)local_148,(sigaction *)0x0);
    if (iVar1 != 0) {
      ReportSystemError("sigaction");
      labExe_local._4_4_ = -1;
    }
  }
  else {
    ReportSystemError("sigaction");
    labExe_local._4_4_ = -1;
  }
  return labExe_local._4_4_;
}

Assistant:

static int _LaunchLabExecutable(char* labExe)
{
    int exitCode = 1;

    fflush(stdout);
    if (-1 == access(".", R_OK | W_OK | X_OK | F_OK)) {
        ReportSystemError("access");
        return exitCode;
    }
    pid_t pid = fork();
    if (-1 == pid) {
        ReportSystemError("fork");
        return exitCode;
    } else if (0 == pid) {
        // in forked process
        if (!freopen("in.txt", "r", stdin)) {
            ReportSystemError("freopen");
            exit(EXIT_FAILURE);
        }
        if (!freopen("out.txt", "w", stdout)) {
            ReportSystemError("freopen");
            exit(EXIT_FAILURE);
        }
        int ret = execl(labExe, labExe, NULL);
        assert(ret == -1);
        (void)ret; // -Wunused-variable for NDEBUG
        ReportSystemError("execl");
        exit(EXIT_FAILURE);
    }
    {
        // in main process
        struct rusage rusage = {0};
        struct timespec rem = {0};
        rem.tv_sec = GetTimeout() / 1000;
        rem.tv_nsec = (GetTimeout() % 1000) * 1000000;
        EWaitStatus status = WaitForProcess(pid, &rem, &rusage);

        if (WaitError == status) {
            ReportSystemError("wait4");
        } else if (Timeout == status) {
            ReportTimeout(labExe);
            if (kill(pid, SIGKILL)) {
                ReportSystemError("kill");
            }
        } else if (Exception == status) {
            ReportException(labExe);
        } else if (NonZeroStatus == status) {
            ReportNonZeroExitCode(labExe);
        } else {
            size_t labMem0 = 0;
            if (CheckMemory(rusage, &labMem0)) {
                ReportOutOfMemory(labExe, labMem0);
            } else {
                exitCode = 0;
            }
        }
    }

    return exitCode;
}